

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_datanode.c
# Opt level: O0

SUNErrCode
SUNDataNode_SetData(SUNDataNode self,SUNMemoryType src_mem_type,SUNMemoryType node_mem_type,
                   void *data,size_t data_stride,size_t data_bytes)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  SUNErrCode err;
  SUNContext_conflict sunctx_local_scope_;
  undefined4 local_4;
  
  if (*(long *)(*in_RDI + 0x60) == 0) {
    local_4 = -0x2701;
  }
  else {
    local_4 = (**(code **)(*in_RDI + 0x60))(in_RDI,in_ESI,in_EDX,in_RCX,in_R8,in_R9);
  }
  return local_4;
}

Assistant:

SUNErrCode SUNDataNode_SetData(SUNDataNode self, SUNMemoryType src_mem_type,
                               SUNMemoryType node_mem_type, void* data,
                               size_t data_stride, size_t data_bytes)
{
  SUNFunctionBegin(self->sunctx);

  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  if (self->ops->setdata)
  {
    SUNErrCode err = self->ops->setdata(self, src_mem_type, node_mem_type, data,
                                        data_stride, data_bytes);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }

  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}